

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

djg_mesh * djgm_load_cylinder(int slices,int stacks)

{
  djgm_vertex *pdVar1;
  djg_mesh *pdVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pdVar2 = djgm_load_plane(slices,stacks);
  uVar5 = stacks + 2;
  lVar7 = 0;
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = (ulong)uVar5;
  }
  iVar3 = -2;
  if (-2 < slices) {
    iVar3 = slices;
  }
  for (uVar8 = 0; uVar6 = uVar4, lVar9 = lVar7, uVar8 != iVar3 + 2; uVar8 = uVar8 + 1) {
    while (uVar6 != 0) {
      pdVar1 = pdVar2->vertexv;
      fVar12 = *(float *)((long)&(pdVar1->st).s + lVar9);
      fVar11 = *(float *)((long)&(pdVar1->st).t + lVar9);
      fVar12 = (fVar12 + fVar12) * 3.1415927;
      fVar10 = cosf(fVar12);
      *(float *)((long)&(pdVar1->p).x + lVar9) = fVar10;
      fVar10 = sinf(fVar12);
      *(float *)((long)&(pdVar1->p).y + lVar9) = fVar10;
      *(float *)((long)&(pdVar1->p).z + lVar9) = fVar11 + fVar11 + -1.0;
      fVar11 = sinf(fVar12);
      *(float *)((long)&(pdVar1->dpds).x + lVar9) = -fVar11;
      fVar12 = cosf(fVar12);
      *(float *)((long)&(pdVar1->dpds).y + lVar9) = fVar12;
      *(undefined4 *)((long)&(pdVar1->dpds).z + lVar9) = 0;
      *(undefined8 *)((long)&(pdVar1->dpdt).x + lVar9) = 0;
      *(undefined4 *)((long)&(pdVar1->dpdt).z + lVar9) = 0x3f800000;
      uVar6 = uVar6 - 1;
      lVar9 = lVar9 + 0x40;
    }
    lVar7 = lVar7 + (long)(int)uVar5 * 0x40;
  }
  return pdVar2;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_cylinder(int slices, int stacks)
{
    djg_mesh *mesh = djgm_load_plane(slices, stacks);;
    int i, j;

    slices+= 2;
    stacks+= 2;

    for (i = 0; i < slices; ++i)
    for (j = 0; j < stacks; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * stacks + j];
        float phi = v->st.s * 2 * M_PI;
        float z = 2 * v->st.t - 1;

        v->p.x = cos(phi);
        v->p.y = sin(phi);
        v->p.z = z;

        v->dpds.x = -sin(phi);
        v->dpds.y = +cos(phi);
        v->dpds.z = 0;

        v->dpdt.x = 0;
        v->dpdt.y = 0;
        v->dpdt.z = 1;
    }

    return mesh;
}